

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O0

bool processShaderConfig(uint32_t lineno,string *shaderConfig)

{
  string *this;
  bool bVar1;
  uint32_t uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t hash;
  ulong uVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *this_01;
  time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar5;
  size_type sVar6;
  mapped_type *this_02;
  path local_780;
  string local_758;
  mapped_type *local_738;
  vector<BlobEntry,_std::allocator<BlobEntry>_> *entries;
  undefined1 local_710 [8];
  BlobEntry entry;
  string local_6a8;
  undefined1 local_688 [8];
  CompileTask task;
  string commandLine;
  undefined1 local_5a0 [8];
  path compiledPermutationFile;
  char buf [16];
  path local_560;
  undefined1 local_538 [8];
  path compiledPermutationName;
  list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> callStack;
  file_time_type sourceHierarchyTime;
  file_time_type compiledFileTime;
  undefined1 local_4c0 [8];
  path compiledShaderFile;
  path local_470;
  undefined1 local_448 [8];
  path compiledShaderPath;
  path local_3f8;
  path local_3d0;
  undefined1 local_3a8 [8];
  path sourceFile;
  path local_360;
  path local_338;
  path local_310;
  undefined1 local_2e8 [8];
  path compiledShaderName;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_29d;
  uint32_t local_29c;
  reference pbStack_298;
  uint32_t permutationHash;
  string *define;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostringstream combinedDefines;
  string local_f0;
  undefined1 local_d0 [8];
  CompilerOptions compilerOptions;
  string *shaderConfig_local;
  uint32_t lineno_local;
  
  compilerOptions.errorMessage.field_2._8_8_ = shaderConfig;
  CompilerOptions::CompilerOptions((CompilerOptions *)local_d0);
  std::__cxx11::string::string
            ((string *)&local_f0,(string *)compilerOptions.errorMessage.field_2._8_8_);
  bVar1 = CompilerOptions::parse((CompilerOptions *)local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    printError(lineno,(string *)
                      &compilerOptions.definitions.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    shaderConfig_local._7_1_ = 0;
    goto LAB_0010c569;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&compilerOptions.outputPath.field_2 + 8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  define = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&define), bVar1) {
    pbStack_298 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    poVar4 = std::operator<<((ostream *)&__range1,(string *)pbStack_298);
    std::operator<<(poVar4," ");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  hash = std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator()(&local_29d,(string *)&compiledShaderName._M_cmpts);
  uVar2 = nvrhi::hash_to_u32(hash);
  std::__cxx11::string::~string((string *)&compiledShaderName._M_cmpts);
  local_29c = uVar2;
  std::filesystem::__cxx11::path::path((path *)local_2e8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::filesystem::__cxx11::path::operator=
              ((path *)local_2e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&compilerOptions.target.field_2 + 8));
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
               auto_format);
    removeLeadingDotDots(&local_310,&local_338);
    std::filesystem::__cxx11::path::operator=((path *)local_2e8,&local_310);
    std::filesystem::__cxx11::path::~path(&local_310);
    std::filesystem::__cxx11::path::~path(&local_338);
    std::filesystem::__cxx11::path::path<char[1],std::filesystem::__cxx11::path>
              (&local_360,(char (*) [1])0x166790,auto_format);
    std::filesystem::__cxx11::path::replace_extension((path *)local_2e8);
    std::filesystem::__cxx11::path::~path(&local_360);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&compilerOptions.shaderName.field_2 + 8),"main"), bVar1)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sourceFile._M_cmpts,"_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&compilerOptions.shaderName.field_2 + 8));
      std::filesystem::__cxx11::path::operator+=
                ((path *)local_2e8,(string_type *)&sourceFile._M_cmpts);
      std::__cxx11::string::~string((string *)&sourceFile._M_cmpts);
    }
    std::filesystem::__cxx11::path::operator+=((path *)local_2e8,".bin");
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_3f8,&g_Options.inputFile,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&compiledShaderPath._M_cmpts,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
             auto_format);
  std::filesystem::__cxx11::operator/
            ((path *)local_3a8,&local_3d0,(path *)&compiledShaderPath._M_cmpts);
  std::filesystem::__cxx11::path::~path((path *)&compiledShaderPath._M_cmpts);
  std::filesystem::__cxx11::path::~path(&local_3d0);
  std::filesystem::__cxx11::path::~path(&local_3f8);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_470,&g_Options.outputPath,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::operator/
            ((path *)local_448,&local_470,(path *)&compiledShaderFile._M_cmpts);
  std::filesystem::__cxx11::path::~path((path *)&compiledShaderFile._M_cmpts);
  std::filesystem::__cxx11::path::~path(&local_470);
  bVar1 = std::filesystem::exists((path *)local_448);
  if (bVar1) {
    if ((g_Options.force & 1U) != 0) goto LAB_0010c0a6;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&compiledFileTime,&g_Options.outputPath,auto_format);
    std::filesystem::__cxx11::operator/
              ((path *)local_4c0,(path *)&compiledFileTime,(path *)local_2e8);
    std::filesystem::__cxx11::path::~path((path *)&compiledFileTime);
    bVar1 = std::filesystem::exists((path *)local_4c0);
    if (bVar1) {
      sourceHierarchyTime.__d.__r = (duration)std::filesystem::last_write_time((path *)local_4c0);
      std::chrono::
      time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&callStack.
                       super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                       ._M_impl._M_node._M_size);
      std::__cxx11::
      list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::list
                ((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)&compiledPermutationName._M_cmpts);
      bVar1 = getHierarchicalUpdateTime
                        ((path *)local_3a8,
                         (list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          *)&compiledPermutationName._M_cmpts,
                         (file_time_type *)
                         &callStack.
                          super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          ._M_impl._M_node._M_size);
      if (bVar1) {
        ptVar5 = std::
                 max<std::chrono::time_point<std::filesystem::__file_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                           ((time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&callStack.
                                super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                ._M_impl._M_node._M_size,&g_ConfigWriteTime);
        callStack.
        super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
        ._M_impl._M_node._M_size = (ptVar5->__d).__r;
        bVar1 = std::chrono::operator>
                          (&sourceHierarchyTime,
                           (time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&callStack.
                               super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                               ._M_impl._M_node._M_size);
        if (bVar1) {
          shaderConfig_local._7_1_ = 1;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      else {
        shaderConfig_local._7_1_ = 0;
        bVar1 = true;
      }
      std::__cxx11::
      list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::~list
                ((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)&compiledPermutationName._M_cmpts);
      if (!bVar1) goto LAB_0010c06b;
    }
    else {
LAB_0010c06b:
      bVar1 = false;
    }
    std::filesystem::__cxx11::path::~path((path *)local_4c0);
    if (!bVar1) goto LAB_0010c0a6;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"INFO: Creating directory ");
    this_01 = std::filesystem::__cxx11::operator<<
                        ((basic_ostream<char,_std::char_traits<char>_> *)poVar4,(path *)local_448);
    std::ostream::operator<<((ostream *)this_01,std::endl<char,std::char_traits<char>>);
    std::filesystem::create_directories((path *)local_448);
LAB_0010c0a6:
    std::filesystem::__cxx11::path::path((path *)local_538,(path *)local_2e8);
    std::filesystem::__cxx11::path::path<char[1],std::filesystem::__cxx11::path>
              (&local_560,(char (*) [1])0x166790,auto_format);
    std::filesystem::__cxx11::path::replace_extension((path *)local_538);
    std::filesystem::__cxx11::path::~path(&local_560);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&compilerOptions.outputPath.field_2 + 8));
    if (sVar6 != 0) {
      sprintf((char *)&compiledPermutationFile._M_cmpts,"_%08x",(ulong)local_29c);
      std::filesystem::__cxx11::path::operator+=
                ((path *)local_538,(char (*) [16])&compiledPermutationFile._M_cmpts);
    }
    std::filesystem::__cxx11::path::operator+=((path *)local_538,".bin");
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)((long)&commandLine.field_2 + 8),&g_Options.outputPath,auto_format);
    std::filesystem::__cxx11::operator/
              ((path *)local_5a0,(path *)((long)&commandLine.field_2 + 8),(path *)local_538);
    std::filesystem::__cxx11::path::~path((path *)((long)&commandLine.field_2 + 8));
    buildCompilerCommandLine
              ((string *)((long)&task.commandLine.field_2 + 8),(CompilerOptions *)local_d0,
               (path *)local_3a8,(path *)local_5a0);
    CompileTask::CompileTask((CompileTask *)local_688);
    std::filesystem::__cxx11::path::generic_string(&local_6a8,(path *)local_3a8);
    std::__cxx11::string::operator=((string *)local_688,(string *)&local_6a8);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::operator=
              ((string *)(task.sourceFile.field_2._M_local_buf + 8),(string *)local_d0);
    std::__cxx11::string::operator=
              ((string *)(task.shaderName.field_2._M_local_buf + 8),
               (string *)(compilerOptions.shaderName.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::str();
    this = (string *)(entry.permutation.field_2._M_local_buf + 8);
    std::__cxx11::string::operator=((string *)(task.entryPoint.field_2._M_local_buf + 8),this);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::operator=
              ((string *)(task.combinedDefines.field_2._M_local_buf + 8),
               (string *)(task.commandLine.field_2._M_local_buf + 8));
    std::vector<CompileTask,_std::allocator<CompileTask>_>::push_back
              (&g_CompileTasks,(value_type *)local_688);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&compilerOptions.outputPath.field_2 + 8));
    if (!bVar1) {
      BlobEntry::BlobEntry((BlobEntry *)local_710);
      std::filesystem::__cxx11::path::operator=((path *)local_710,(path *)local_5a0);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=
                ((string *)&entry.compiledPermutationFile._M_cmpts,(string *)&entries);
      std::__cxx11::string::~string((string *)&entries);
      std::filesystem::__cxx11::path::path(&local_780,(path *)local_2e8);
      path_string(&local_758,&local_780);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>_>_>
                ::operator[](&g_ShaderBlobs_abi_cxx11_,&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::filesystem::__cxx11::path::~path(&local_780);
      local_738 = this_02;
      std::vector<BlobEntry,_std::allocator<BlobEntry>_>::push_back(this_02,(value_type *)local_710)
      ;
      BlobEntry::~BlobEntry((BlobEntry *)local_710);
    }
    shaderConfig_local._7_1_ = 1;
    CompileTask::~CompileTask((CompileTask *)local_688);
    std::__cxx11::string::~string((string *)(task.commandLine.field_2._M_local_buf + 8));
    std::filesystem::__cxx11::path::~path((path *)local_5a0);
    std::filesystem::__cxx11::path::~path((path *)local_538);
  }
  std::filesystem::__cxx11::path::~path((path *)local_448);
  std::filesystem::__cxx11::path::~path((path *)local_3a8);
  std::filesystem::__cxx11::path::~path((path *)local_2e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
LAB_0010c569:
  CompilerOptions::~CompilerOptions((CompilerOptions *)local_d0);
  return (bool)(shaderConfig_local._7_1_ & 1);
}

Assistant:

bool processShaderConfig(uint32_t lineno, const string& shaderConfig)
{
	CompilerOptions compilerOptions;
	if (!compilerOptions.parse(shaderConfig))
	{
		printError(lineno, compilerOptions.errorMessage);
		return false;
	}
	
	ostringstream combinedDefines;
	for (const string& define : compilerOptions.definitions)
	{
		combinedDefines << define << " ";
	}

	uint32_t permutationHash = nvrhi::hash_to_u32(std::hash<std::string>()(combinedDefines.str()));

	fs::path compiledShaderName;
	if (compilerOptions.outputPath.empty())
	{
		compiledShaderName = removeLeadingDotDots(compilerOptions.shaderName);
		compiledShaderName.replace_extension("");
		if (!compilerOptions.entryPoint.empty() && compilerOptions.entryPoint != "main")
			compiledShaderName += "_" + compilerOptions.entryPoint;
		compiledShaderName += ".bin";
	}
	else
	{
		compiledShaderName = compilerOptions.outputPath;
	}

	fs::path sourceFile = fs::path(g_Options.inputFile).parent_path() / compilerOptions.shaderName;

	fs::path compiledShaderPath = g_Options.outputPath / compiledShaderName.parent_path();
	if (!fs::exists(compiledShaderPath))
	{
		cout << "INFO: Creating directory " << compiledShaderPath << endl;
		fs::create_directories(compiledShaderPath);
	}
	else if(!g_Options.force)
	{
		fs::path compiledShaderFile = g_Options.outputPath / compiledShaderName;
		if (fs::exists(compiledShaderFile))
		{
			fs::file_time_type compiledFileTime = fs::last_write_time(compiledShaderFile);

			fs::file_time_type sourceHierarchyTime;
			list<fs::path> callStack;
			if (!getHierarchicalUpdateTime(sourceFile, callStack, sourceHierarchyTime))
				return false;

			sourceHierarchyTime = std::max(sourceHierarchyTime, g_ConfigWriteTime);

			if (compiledFileTime > sourceHierarchyTime)
				return true;
		}
	}

	fs::path compiledPermutationName = compiledShaderName;
	compiledPermutationName.replace_extension("");
	if (compilerOptions.definitions.size() > 0)
	{
		char buf[16];
		sprintf(buf, "_%08x", permutationHash);
		compiledPermutationName += buf;
	}
	compiledPermutationName += ".bin";

	fs::path compiledPermutationFile = g_Options.outputPath / compiledPermutationName;

	string commandLine = buildCompilerCommandLine(compilerOptions, sourceFile, compiledPermutationFile);
	
	CompileTask task;
	task.sourceFile = sourceFile.generic_string();
	task.shaderName = compilerOptions.shaderName;
	task.entryPoint = compilerOptions.entryPoint;
	task.combinedDefines = combinedDefines.str();
	task.commandLine = commandLine;
	g_CompileTasks.push_back(task);

	if (!compilerOptions.definitions.empty())
	{
		BlobEntry entry;
		entry.compiledPermutationFile = compiledPermutationFile;
		entry.permutation = combinedDefines.str();

		vector<BlobEntry>& entries = g_ShaderBlobs[path_string(compiledShaderName)];
		entries.push_back(entry);
	}

	return true;
}